

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

uint8 * __thiscall
google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliasedOutline
          (EpsCopyOutputStream *this,uint32 num,string *s,uint8 *ptr)

{
  uint size;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint8 *puVar4;
  byte *pbVar5;
  byte *pbVar6;
  uint uVar7;
  byte *local_28;
  
  local_28 = ptr;
  EnsureSpace(this,&local_28);
  size = (uint)s->_M_string_length;
  uVar7 = num << 3;
  uVar3 = size;
  if (uVar7 < 0x80) {
    *local_28 = (byte)uVar7 | 2;
    pbVar5 = local_28 + 1;
  }
  else {
    *local_28 = (byte)uVar7 | 0x82;
    if (uVar7 < 0x4000) {
      local_28[1] = (byte)(uVar7 >> 7);
      pbVar5 = local_28 + 2;
    }
    else {
      pbVar5 = local_28 + 2;
      uVar7 = uVar7 >> 7;
      do {
        pbVar6 = pbVar5;
        pbVar6[-1] = (byte)uVar7 | 0x80;
        uVar2 = uVar7 >> 7;
        pbVar5 = pbVar6 + 1;
        bVar1 = 0x3fff < uVar7;
        uVar7 = uVar2;
      } while (bVar1);
      *pbVar6 = (byte)uVar2;
    }
  }
  while( true ) {
    local_28 = pbVar5 + 1;
    if (uVar3 < 0x80) break;
    *pbVar5 = (byte)uVar3 | 0x80;
    uVar3 = uVar3 >> 7;
    pbVar5 = local_28;
  }
  *pbVar5 = (byte)uVar3;
  puVar4 = WriteRawMaybeAliased(this,(s->_M_dataplus)._M_p,size,local_28);
  return puVar4;
}

Assistant:

uint8* EpsCopyOutputStream::WriteStringMaybeAliasedOutline(uint32 num,
                                                           const std::string& s,
                                                           uint8* ptr) {
  EnsureSpace(&ptr);
  uint32 size = s.size();
  ptr = WriteLengthDelim(num, size, ptr);
  return WriteRawMaybeAliased(s.data(), size, ptr);
}